

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

Continuation * scm::trampoline::displayFunction(void)

{
  Verbosity VVar1;
  uint uVar2;
  ostream *poVar3;
  Continuation *pCVar4;
  int n;
  Object *extraout_RDX;
  Object *obj;
  Object *extraout_RDX_00;
  pointer ppOVar5;
  double __x;
  ObjectVec arguments;
  string local_40;
  
  VVar1 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar1) && (LOG_TRAMPOLINE_TRACE != '\0')) {
    loguru::log(__x);
  }
  uVar2 = popArg<int>();
  popArgs<scm::Object*>(&arguments,(trampoline *)(ulong)uVar2,n);
  obj = extraout_RDX;
  for (ppOVar5 = arguments.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      ppOVar5 !=
      arguments.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start; ppOVar5 = ppOVar5 + -1) {
    toString_abi_cxx11_(&local_40,(scm *)ppOVar5[-1],obj);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_40);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_40);
    obj = extraout_RDX_00;
  }
  std::operator<<((ostream *)&std::cout,'\n');
  lastReturnValue = SCM_VOID;
  pCVar4 = popFunc();
  std::_Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>::~_Vector_base
            (&arguments.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>);
  return pCVar4;
}

Assistant:

Continuation* displayFunction()
{
  DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: displayFunction");
  int nArgs{popArg<int>()};
  ObjectVec arguments{popArgs<Object*>(nArgs)};
  for (auto argument{arguments.rbegin()}; argument != arguments.rend(); argument++) {
    std::cout << toString(*argument) << " ";
  }
  std::cout << '\n';
  t_RETURN(SCM_VOID);
}